

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O1

void __thiscall SQClass::SQClass(SQClass *this,SQSharedState *ss,SQClass *base)

{
  long *plVar1;
  SQUnsignedInteger *pSVar2;
  uint uVar3;
  uint uVar4;
  long *plVar5;
  SQInteger SVar6;
  long lVar7;
  SQTable *this_00;
  EVP_PKEY_CTX *src;
  
  (this->super_SQCollectable).super_SQRefCounted._uiRef = 0;
  (this->super_SQCollectable).super_SQRefCounted._weakref = (SQWeakRef *)0x0;
  (this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted =
       (_func_int **)&PTR__SQClass_001427d0;
  (this->_defaultvalues)._vals = (SQClassMember *)0x0;
  (this->_defaultvalues)._size = 0;
  (this->_defaultvalues)._allocated = 0;
  (this->_methods)._vals = (SQClassMember *)0x0;
  (this->_methods)._size = 0;
  (this->_methods)._allocated = 0;
  lVar7 = 0x78;
  do {
    *(undefined8 *)
     ((long)&(((SQClass *)(this->_metamethods + -7))->super_SQCollectable).super_SQRefCounted.
             _vptr_SQRefCounted + lVar7) = 0;
    *(undefined4 *)((long)this->_metamethods + lVar7 + -0x78) = 0x1000001;
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x198);
  (this->_attributes).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->_attributes).super_SQObject._type = OT_NULL;
  this->_base = base;
  this->_udsize = 0;
  this->_typetag = (SQUserPointer)0x0;
  this->_hook = (SQRELEASEHOOK)0x0;
  this->_locked = false;
  this->_constructoridx = -1;
  if (base != (SQClass *)0x0) {
    SVar6 = base->_udsize;
    this->_constructoridx = base->_constructoridx;
    this->_udsize = SVar6;
    sqvector<SQClassMember>::copy
              (&this->_defaultvalues,(EVP_PKEY_CTX *)&base->_defaultvalues,(EVP_PKEY_CTX *)base);
    sqvector<SQClassMember>::copy(&this->_methods,(EVP_PKEY_CTX *)&base->_methods,src);
    lVar7 = 0x78;
    do {
      uVar3 = *(uint *)((long)this->_metamethods + lVar7 + -0x78);
      plVar5 = *(long **)((long)&(((SQClass *)(this->_metamethods + -7))->super_SQCollectable).
                                 super_SQRefCounted._vptr_SQRefCounted + lVar7);
      *(undefined8 *)
       ((long)&(((SQClass *)(this->_metamethods + -7))->super_SQCollectable).super_SQRefCounted.
               _vptr_SQRefCounted + lVar7) =
           *(undefined8 *)
            ((long)&(((SQClass *)(base->_metamethods + -7))->super_SQCollectable).super_SQRefCounted
                    ._vptr_SQRefCounted + lVar7);
      uVar4 = *(uint *)((long)base->_metamethods + lVar7 + -0x78);
      *(uint *)((long)this->_metamethods + lVar7 + -0x78) = uVar4;
      if ((uVar4 >> 0x1b & 1) != 0) {
        plVar1 = (long *)(*(long *)((long)&(((SQClass *)(this->_metamethods + -7))->
                                           super_SQCollectable).super_SQRefCounted.
                                           _vptr_SQRefCounted + lVar7) + 8);
        *plVar1 = *plVar1 + 1;
      }
      if ((uVar3 >> 0x1b & 1) != 0) {
        plVar1 = plVar5 + 1;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (**(code **)(*plVar5 + 0x10))();
        }
      }
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x198);
    pSVar2 = &(this->_base->super_SQCollectable).super_SQRefCounted._uiRef;
    *pSVar2 = *pSVar2 + 1;
    if (base != (SQClass *)0x0) {
      this_00 = SQTable::Clone(base->_members);
      goto LAB_00119571;
    }
  }
  this_00 = (SQTable *)sq_vm_malloc(0x58);
  SQTable::SQTable(this_00,ss,0);
  (this_00->super_SQDelegable)._delegate = (SQTable *)0x0;
LAB_00119571:
  this->_members = this_00;
  pSVar2 = &(this_00->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar2 = *pSVar2 + 1;
  (this->super_SQCollectable)._next = (SQCollectable *)0x0;
  (this->super_SQCollectable)._prev = (SQCollectable *)0x0;
  (this->super_SQCollectable)._sharedstate = ss;
  SQCollectable::AddToChain(&ss->_gc_chain,(SQCollectable_conflict *)this);
  return;
}

Assistant:

SQClass::SQClass(SQSharedState *ss,SQClass *base)
{
    _base = base;
    _typetag = 0;
    _hook = NULL;
    _udsize = 0;
    _locked = false;
    _constructoridx = -1;
    if(_base) {
        _constructoridx = _base->_constructoridx;
        _udsize = _base->_udsize;
        _defaultvalues.copy(base->_defaultvalues);
        _methods.copy(base->_methods);
        _COPY_VECTOR(_metamethods,base->_metamethods,MT_LAST);
        __ObjAddRef(_base);
    }
    _members = base?base->_members->Clone() : SQTable::Create(ss,0);
    __ObjAddRef(_members);

    INIT_CHAIN();
    ADD_TO_CHAIN(&_sharedstate->_gc_chain, this);
}